

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::quoted_key(spec *s)

{
  either *in_RDI;
  spec *in_stack_00000008;
  either *this;
  sequence *in_stack_ffffffffffffffa0;
  sequence *in_stack_ffffffffffffffa8;
  either *in_stack_ffffffffffffffb0;
  
  this = in_RDI;
  basic_string(in_stack_00000008);
  literal_string(in_stack_00000008);
  either::either<toml::detail::sequence,toml::detail::sequence>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  sequence::~sequence((sequence *)this);
  sequence::~sequence((sequence *)this);
  return in_RDI;
}

Assistant:

TOML11_INLINE either quoted_key(const spec& s)
{
    return either(basic_string(s), literal_string(s));
}